

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

uint64_t double_conversion::ReadUInt64(Vector<const_char> buffer,int from,int digits_to_read)

{
  uint64_t uVar1;
  long lVar2;
  int i;
  
  uVar1 = 0;
  for (lVar2 = (long)buffer.length_; lVar2 < from + buffer.length_; lVar2 = lVar2 + 1) {
    uVar1 = (uVar1 * 10 + (long)buffer.start_[lVar2]) - 0x30;
  }
  return uVar1;
}

Assistant:

static uint64_t ReadUInt64(const Vector<const char> buffer,
                           const int from,
                           const int digits_to_read) {
  uint64_t result = 0;
  for (int i = from; i < from + digits_to_read; ++i) {
    const int digit = buffer[i] - '0';
    DOUBLE_CONVERSION_ASSERT(0 <= digit && digit <= 9);
    result = result * 10 + digit;
  }
  return result;
}